

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDiscardTests.cpp
# Opt level: O2

TestInstance * __thiscall
vkt::sr::anon_unknown_0::ShaderDiscardCase::createInstance(ShaderDiscardCase *this,Context *context)

{
  bool bVar1;
  ShaderRenderCaseInstance *this_00;
  TextureBinding *this_01;
  SharedPtr<vkt::sr::TextureBinding> brickTexture;
  Sampler local_68;
  
  this_00 = (ShaderRenderCaseInstance *)operator_new(0x210);
  bVar1 = this->m_usesTexture;
  ShaderRenderCaseInstance::ShaderRenderCaseInstance
            (this_00,context,(this->super_ShaderRenderCase).m_isVertexCase,
             (this->super_ShaderRenderCase).m_evaluator.
             super_UniqueBase<const_vkt::sr::ShaderEvaluator,_de::DefaultDeleter<const_vkt::sr::ShaderEvaluator>_>
             .m_data.ptr,
             (this->super_ShaderRenderCase).m_uniformSetup.
             super_UniqueBase<const_vkt::sr::UniformSetup,_de::DefaultDeleter<const_vkt::sr::UniformSetup>_>
             .m_data.ptr,(AttributeSetupFunc)0x0,IMAGE_BACKING_MODE_REGULAR,0);
  (this_00->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__ShaderRenderCaseInstance_00bd1bf0;
  if (bVar1 != false) {
    this_01 = (TextureBinding *)operator_new(0x68);
    local_68.wrapS = CLAMP_TO_EDGE;
    local_68.wrapT = CLAMP_TO_EDGE;
    local_68.wrapR = CLAMP_TO_EDGE;
    local_68.minFilter = LINEAR;
    local_68.magFilter = LINEAR;
    local_68.lodThreshold = 0.0;
    local_68.normalizedCoords = true;
    local_68.depthStencilMode = MODE_DEPTH;
    local_68.compare = COMPAREMODE_NONE;
    local_68.compareChannel = 0;
    local_68.borderColor.v.uData[0]._0_1_ = 0;
    local_68.borderColor.v._1_7_ = 0;
    local_68.borderColor.v.uData[2]._0_1_ = 0;
    local_68._45_8_ = 0;
    TextureBinding::TextureBinding
              (this_01,((this_00->super_TestInstance).m_context)->m_testCtx->m_curArchive,
               "vulkan/data/brick.png",TYPE_2D,&local_68);
    de::SharedPtr<vkt::sr::TextureBinding>::SharedPtr(&brickTexture,this_01);
    std::
    vector<de::SharedPtr<vkt::sr::TextureBinding>,_std::allocator<de::SharedPtr<vkt::sr::TextureBinding>_>_>
    ::push_back(&this_00->m_textures,&brickTexture);
    de::SharedPtr<vkt::sr::TextureBinding>::~SharedPtr(&brickTexture);
  }
  return &this_00->super_TestInstance;
}

Assistant:

virtual TestInstance*	createInstance				(Context& context) const
							{
								DE_ASSERT(m_evaluator != DE_NULL);
								DE_ASSERT(m_uniformSetup != DE_NULL);
								return new ShaderDiscardCaseInstance(context, m_isVertexCase, *m_evaluator, *m_uniformSetup, m_usesTexture);
							}